

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O3

UMat * __thiscall
FlickerRemover::removeFlickering(FlickerRemover *this,UMat *frame,double timestamp,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  OpenCLKernels *this_00;
  pointer pUVar5;
  pointer pcVar6;
  uint uVar7;
  Size **ppSVar8;
  Size **ppSVar9;
  FlickerRemover *pFVar10;
  uint uVar11;
  bool bVar12;
  long *plVar13;
  undefined8 *puVar14;
  _Alloc_hider src_2;
  _InputArray *p_Var15;
  UMat *pUVar16;
  UMat *pUVar17;
  UMat *pUVar18;
  uint uVar19;
  Size *pSVar20;
  long *plVar21;
  ulong *puVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  Size SVar28;
  undefined8 uVar29;
  Size SVar30;
  undefined8 uVar31;
  long lVar32;
  _InputArray local_218;
  long lStack_200;
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _OutputArray local_1d8;
  long lStack_1c0;
  _InputArray local_1b8;
  long lStack_1a0;
  string *local_190;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  string __str;
  string __str_1;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  string __str_2;
  long *local_e0;
  undefined8 local_d8;
  long local_d0;
  undefined8 uStack_c8;
  UMat *local_c0;
  UMat *local_b8;
  string __str_3;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  UMat *local_70;
  FlickerRemover *local_68;
  CircularBuffer<cv::UMat_*> *local_60;
  UMat *local_58;
  string local_50;
  
  iVar3 = *(int *)(frame + 8);
  uVar4 = *(uint *)(frame + 0xc);
  if ((iVar3 == this->frame_rows) && (uVar4 == this->frame_cols)) {
    dVar2 = this->expected_timestamp;
    if (((dVar2 != -1.0) || (NAN(dVar2))) &&
       (this->accepted_timestamp_difference <= ABS(dVar2 - timestamp))) {
      if (timestamp < dVar2) {
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   vsnprintf,0x148,"%f");
        plVar13 = (long *)std::__cxx11::string::replace((ulong)local_188,0,(char *)0x0,0x117c3e);
        ppSVar8 = (Size **)&local_1d8.super__InputArray.sz;
        pSVar20 = (Size *)(plVar13 + 2);
        if ((Size *)*plVar13 == pSVar20) {
          local_1d8.super__InputArray.sz = *pSVar20;
          lStack_1c0 = plVar13[3];
          local_1d8.super__InputArray._0_8_ = ppSVar8;
        }
        else {
          local_1d8.super__InputArray.sz = *pSVar20;
          local_1d8.super__InputArray._0_8_ = (Size *)*plVar13;
        }
        local_1d8.super__InputArray.obj = (void *)plVar13[1];
        *plVar13 = (long)pSVar20;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_1d8);
        ppSVar9 = (Size **)&local_218.sz;
        pSVar20 = (Size *)(plVar13 + 2);
        if ((Size *)*plVar13 == pSVar20) {
          local_218.sz = *pSVar20;
          lStack_200 = plVar13[3];
          local_218._0_8_ = ppSVar9;
        }
        else {
          local_218.sz = *pSVar20;
          local_218._0_8_ = (Size *)*plVar13;
        }
        local_218.obj = (void *)plVar13[1];
        *plVar13 = (long)pSVar20;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   vsnprintf,0x148,"%f",SUB84(this->expected_timestamp,0));
        SVar30.width = 0xf;
        SVar30.height = 0;
        if ((Size **)local_218._0_8_ != ppSVar9) {
          SVar30 = local_218.sz;
        }
        if ((ulong)SVar30 < (ulong)(local_1f8._8_8_ + (long)local_218.obj)) {
          uVar31._0_4_ = 0xf;
          uVar31._4_4_ = 0;
          if ((Size *)local_1f8._0_8_ != (Size *)(local_1f8 + 0x10)) {
            uVar31 = local_1e8._M_allocated_capacity;
          }
          if ((ulong)uVar31 < (ulong)(local_1f8._8_8_ + (long)local_218.obj)) goto LAB_00110dc2;
          plVar13 = (long *)std::__cxx11::string::replace
                                      ((ulong)local_1f8,0,(char *)0x0,local_218._0_8_);
        }
        else {
LAB_00110dc2:
          plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_218,local_1f8._0_8_);
        }
        local_1b8._0_8_ = &local_1b8.sz;
        pSVar20 = (Size *)(plVar13 + 2);
        if ((Size *)*plVar13 == pSVar20) {
          local_1b8.sz = *pSVar20;
          lStack_1a0 = plVar13[3];
        }
        else {
          local_1b8.sz = *pSVar20;
          local_1b8._0_8_ = (Size *)*plVar13;
        }
        local_1b8.obj = (void *)plVar13[1];
        *plVar13 = (long)pSVar20;
        plVar13[1] = 0;
        *(undefined1 *)&pSVar20->width = 0;
        std::__cxx11::string::operator=((string *)error,(string *)&local_1b8);
        if ((Size *)local_1b8._0_8_ != &local_1b8.sz) {
          operator_delete((void *)local_1b8._0_8_,(ulong)((long)local_1b8.sz + 1));
        }
        if ((Size *)local_1f8._0_8_ != (Size *)(local_1f8 + 0x10)) {
          operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._M_allocated_capacity + 1));
        }
        if ((Size **)local_218._0_8_ != ppSVar9) {
          operator_delete((void *)local_218._0_8_,(ulong)((long)local_218.sz + 1));
        }
        if ((Size **)local_1d8.super__InputArray._0_8_ != ppSVar8) {
          operator_delete((void *)local_1d8.super__InputArray._0_8_,
                          (ulong)((long)local_1d8.super__InputArray.sz + 1));
        }
        __str.field_2._M_allocated_capacity = local_178._M_allocated_capacity;
        src_2._M_p = (pointer)local_188._0_8_;
        if ((UMat *)local_188._0_8_ == (UMat *)(local_188 + 0x10)) {
          return (UMat *)0x0;
        }
        goto LAB_00110897;
      }
      this->actual_mask =
           ((int)(long)(((timestamp - dVar2) + this->accepted_timestamp_difference) /
                       this->timestamps_delta) + this->actual_mask) % (this->number_of_masks + 1);
      this->expected_timestamp = timestamp;
    }
    this->expected_timestamp = timestamp + this->timestamps_delta;
    src_2._M_p = (pointer)operator_new(0x50);
    cv::UMat::UMat((UMat *)src_2._M_p,iVar3,uVar4);
    if (this->actual_mask == this->number_of_masks) {
      this->actual_mask = 0;
      local_1b8.sz.width = 0;
      local_1b8.sz.height = 0;
      local_1b8.flags = 0x20a0000;
      local_1b8.obj = src_2._M_p;
      cv::UMat::convertTo((_OutputArray *)frame,(int)&local_1b8,1.0,0.0);
    }
    else {
      local_1b8.sz.width = 0;
      local_1b8.sz.height = 0;
      local_1b8.flags = 0x10a0000;
      local_218.obj =
           (this->masks).super__Vector_base<cv::UMat,_std::allocator<cv::UMat>_>._M_impl.
           super__Vector_impl_data._M_start + (ulong)this->actual_mask * 0x50;
      local_218.sz.width = 0;
      local_218.sz.height = 0;
      local_218.flags = 0x10a0000;
      local_1d8.super__InputArray.sz.width = 0;
      local_1d8.super__InputArray.sz.height = 0;
      local_1d8.super__InputArray.flags = 0x20a0000;
      local_1d8.super__InputArray.obj = src_2._M_p;
      local_1b8.obj = frame;
      p_Var15 = (_InputArray *)cv::noArray();
      cv::subtract(&local_1b8,&local_218,&local_1d8,p_Var15,0);
      this->actual_mask = this->actual_mask + 1;
    }
    if (((this->frames_block).count_of_elements != 0) &&
       (pUVar18 = (this->frames_block).data[(this->frames_block).last_element_index],
       pUVar18 != (UMat *)0x0)) {
      pUVar16 = (UMat *)operator_new(0x50);
      local_1b8.sz.width = 0;
      local_1b8.sz.height = 0;
      lStack_1a0 = 0;
      local_1b8._0_8_ = (Size *)0x0;
      local_1b8.obj = (UMat *)0x0;
      cv::UMat::UMat(pUVar16,this->frame_rows,this->frame_cols,0,&local_1b8,0);
      pUVar17 = CircularBuffer<cv::UMat_*>::push(&this->adjacent_frames_similarity_levels,pUVar16);
      bVar12 = OpenCLKernels::runKernelUpdateSimilarityLevels
                         (this->opencl_kernels,pUVar18,(UMat *)src_2._M_p,pUVar17,
                          this->flickering_threshold,pUVar16,&this->adjacent_frames_similarity_sum,
                          error);
      cv::UMat::~UMat(pUVar17);
      operator_delete(pUVar17,0x50);
      if (!bVar12) {
        cv::UMat::~UMat((UMat *)src_2._M_p);
        uVar25 = 0x50;
        goto LAB_0011089a;
      }
    }
    local_60 = &this->frames_block;
    pUVar18 = CircularBuffer<cv::UMat_*>::push(local_60,(UMat *)src_2._M_p);
    if (pUVar18 != (UMat *)0x0) {
      pUVar16 = (UMat *)operator_new(0x50);
      local_1b8.sz.width = 0;
      local_1b8.sz.height = 0;
      lStack_1a0 = 0;
      local_1b8._0_8_ = (Size *)0x0;
      local_1b8.obj = (UMat *)0x0;
      cv::UMat::UMat(pUVar16,this->frame_rows,this->frame_cols,0,&local_1b8,0);
      pUVar17 = CircularBuffer<cv::UMat_*>::push
                          (&this->corresponding_frames_similarity_levels,pUVar16);
      bVar12 = OpenCLKernels::runKernelUpdateSimilarityLevels
                         (this->opencl_kernels,pUVar18,(UMat *)src_2._M_p,pUVar17,
                          this->flickering_threshold,pUVar16,
                          &this->corresponding_frames_similarity_sum,error);
      cv::UMat::~UMat(pUVar17);
      operator_delete(pUVar17,0x50);
      if (!bVar12) {
        return (UMat *)0x0;
      }
    }
    if (this->actual_mask != this->number_of_masks) {
      return (UMat *)src_2._M_p;
    }
    if ((this->frames_block).count_of_elements != (this->frames_block).count_of_slots) {
      return (UMat *)src_2._M_p;
    }
    local_c0 = &this->flicker_counter;
    bVar12 = OpenCLKernels::runKernelUpdateFlickerCounter
                       (this->opencl_kernels,&this->adjacent_frames_similarity_sum,this->actual_mask
                        ,&this->corresponding_frames_similarity_sum,(float)this->block_size * 0.7,
                        local_c0,error);
    if (bVar12) {
      lVar24 = 0;
      lVar32 = 0;
      local_190 = error;
      local_70 = (UMat *)src_2._M_p;
      local_68 = this;
      while (pFVar10 = local_68, this_00 = local_68->opencl_kernels,
            lVar32 < (int)local_68->number_of_masks) {
        if ((int)(local_68->frames_block).count_of_elements < 1) {
          local_b8 = (UMat *)0x0;
        }
        else {
          local_b8 = (local_68->frames_block).data
                     [(int)((local_68->frames_block).first_element_index %
                           (local_68->frames_block).count_of_slots)];
        }
        local_58 = CircularBuffer<cv::UMat_*>::operator[](local_60,(int)lVar32 + 1);
        iVar3 = pFVar10->max_allowed_flicker_duration;
        pUVar5 = (pFVar10->masks).super__Vector_base<cv::UMat,_std::allocator<cv::UMat>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar6 = (local_190->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar6,pcVar6 + local_190->_M_string_length);
        bVar12 = OpenCLKernels::runKernelUpdateMasks
                           (this_00,local_b8,local_58,local_c0,iVar3,pUVar5 + lVar24,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        lVar24 = lVar24 + 0x50;
        lVar32 = lVar32 + 1;
        if (!bVar12) {
          return (UMat *)0x0;
        }
      }
      bVar12 = OpenCLKernels::runKernelZeroFlickerCounter
                         (this_00,local_68->max_allowed_flicker_duration,local_c0,local_190);
      if (bVar12) {
        return local_70;
      }
    }
  }
  else {
    uVar7 = -uVar4;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar23 = 1;
    if (9 < uVar7) {
      uVar25 = (ulong)uVar7;
      uVar11 = 4;
      do {
        uVar23 = uVar11;
        uVar19 = (uint)uVar25;
        if (uVar19 < 100) {
          uVar23 = uVar23 - 2;
          goto LAB_001100e3;
        }
        if (uVar19 < 1000) {
          uVar23 = uVar23 - 1;
          goto LAB_001100e3;
        }
        if (uVar19 < 10000) goto LAB_001100e3;
        uVar25 = uVar25 / 10000;
        uVar11 = uVar23 + 4;
      } while (99999 < uVar19);
      uVar23 = uVar23 + 1;
    }
LAB_001100e3:
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    local_190 = error;
    std::__cxx11::string::_M_construct((ulong)&__str,(char)uVar23 - (char)((int)uVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (__str._M_dataplus._M_p + (uVar4 >> 0x1f),uVar23,uVar7);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x117bee);
    local_90 = &local_80;
    plVar21 = plVar13 + 2;
    if ((long *)*plVar13 == plVar21) {
      local_80 = *plVar21;
      lStack_78 = plVar13[3];
    }
    else {
      local_80 = *plVar21;
      local_90 = (long *)*plVar13;
    }
    local_88 = plVar13[1];
    *plVar13 = (long)plVar21;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_90);
    puVar22 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar22) {
      local_110 = *puVar22;
      lStack_108 = plVar13[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *puVar22;
      local_120 = (ulong *)*plVar13;
    }
    local_118 = plVar13[1];
    *plVar13 = (long)puVar22;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    uVar4 = *(uint *)(frame + 8);
    uVar7 = -uVar4;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar23 = 1;
    if (9 < uVar7) {
      uVar25 = (ulong)uVar7;
      uVar11 = 4;
      do {
        uVar23 = uVar11;
        uVar19 = (uint)uVar25;
        if (uVar19 < 100) {
          uVar23 = uVar23 - 2;
          goto LAB_00110255;
        }
        if (uVar19 < 1000) {
          uVar23 = uVar23 - 1;
          goto LAB_00110255;
        }
        if (uVar19 < 10000) goto LAB_00110255;
        uVar25 = uVar25 / 10000;
        uVar11 = uVar23 + 4;
      } while (99999 < uVar19);
      uVar23 = uVar23 + 1;
    }
LAB_00110255:
    __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
    std::__cxx11::string::_M_construct((ulong)&__str_1,(char)uVar23 - (char)((int)uVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (__str_1._M_dataplus._M_p + (uVar4 >> 0x1f),uVar23,uVar7);
    uVar25 = 0xf;
    if (local_120 != &local_110) {
      uVar25 = local_110;
    }
    if (uVar25 < __str_1._M_string_length + local_118) {
      uVar26 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        uVar26 = __str_1.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar26 < __str_1._M_string_length + local_118) goto LAB_001102e9;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,(ulong)local_120);
    }
    else {
LAB_001102e9:
      puVar14 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_120,(ulong)__str_1._M_dataplus._M_p);
    }
    local_e0 = &local_d0;
    plVar13 = puVar14 + 2;
    if ((long *)*puVar14 == plVar13) {
      local_d0 = *plVar13;
      uStack_c8 = puVar14[3];
    }
    else {
      local_d0 = *plVar13;
      local_e0 = (long *)*puVar14;
    }
    local_d8 = puVar14[1];
    *puVar14 = plVar13;
    puVar14[1] = 0;
    *(undefined1 *)plVar13 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_e0);
    pSVar20 = (Size *)(plVar13 + 2);
    if ((Size *)*plVar13 == pSVar20) {
      local_1e8._M_allocated_capacity = (size_type)*pSVar20;
      local_1e8._8_8_ = plVar13[3];
      local_1f8._0_8_ = (Size *)(local_1f8 + 0x10);
    }
    else {
      local_1e8._M_allocated_capacity = (size_type)*pSVar20;
      local_1f8._0_8_ = (Size *)*plVar13;
    }
    local_1f8._8_8_ = plVar13[1];
    *plVar13 = (long)pSVar20;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    uVar4 = this->frame_cols;
    uVar7 = -uVar4;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar23 = 1;
    if (9 < uVar7) {
      uVar25 = (ulong)uVar7;
      uVar11 = 4;
      do {
        uVar23 = uVar11;
        uVar19 = (uint)uVar25;
        if (uVar19 < 100) {
          uVar23 = uVar23 - 2;
          goto LAB_0011041e;
        }
        if (uVar19 < 1000) {
          uVar23 = uVar23 - 1;
          goto LAB_0011041e;
        }
        if (uVar19 < 10000) goto LAB_0011041e;
        uVar25 = uVar25 / 10000;
        uVar11 = uVar23 + 4;
      } while (99999 < uVar19);
      uVar23 = uVar23 + 1;
    }
LAB_0011041e:
    __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
    std::__cxx11::string::_M_construct((ulong)&__str_2,(char)uVar23 - (char)((int)uVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (__str_2._M_dataplus._M_p + (uVar4 >> 0x1f),uVar23,uVar7);
    uVar26._0_4_ = 0xf;
    uVar26._4_4_ = 0;
    if ((Size *)local_1f8._0_8_ != (Size *)(local_1f8 + 0x10)) {
      uVar26 = local_1e8._M_allocated_capacity;
    }
    if ((ulong)uVar26 < __str_2._M_string_length + local_1f8._8_8_) {
      uVar27._0_4_ = 0xf;
      uVar27._4_4_ = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
        uVar27 = __str_2.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar27 < __str_2._M_string_length + local_1f8._8_8_) goto LAB_001104a1;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&__str_2,0,(char *)0x0,local_1f8._0_8_);
    }
    else {
LAB_001104a1:
      puVar14 = (undefined8 *)
                std::__cxx11::string::_M_append(local_1f8,(ulong)__str_2._M_dataplus._M_p);
    }
    local_188._0_8_ = local_188 + 0x10;
    pUVar18 = (UMat *)(puVar14 + 2);
    if ((UMat *)*puVar14 == pUVar18) {
      local_178._M_allocated_capacity = *(undefined8 *)pUVar18;
      local_178._8_8_ = puVar14[3];
    }
    else {
      local_178._M_allocated_capacity = *(undefined8 *)pUVar18;
      local_188._0_8_ = (UMat *)*puVar14;
    }
    local_188._8_8_ = puVar14[1];
    *puVar14 = pUVar18;
    puVar14[1] = 0;
    *pUVar18 = (UMat)0x0;
    plVar13 = (long *)std::__cxx11::string::append(local_188);
    ppSVar8 = (Size **)&local_1d8.super__InputArray.sz;
    pSVar20 = (Size *)(plVar13 + 2);
    if ((Size *)*plVar13 == pSVar20) {
      local_1d8.super__InputArray.sz = *pSVar20;
      lStack_1c0 = plVar13[3];
      local_1d8.super__InputArray._0_8_ = ppSVar8;
    }
    else {
      local_1d8.super__InputArray.sz = *pSVar20;
      local_1d8.super__InputArray._0_8_ = (Size *)*plVar13;
    }
    local_1d8.super__InputArray.obj = (void *)plVar13[1];
    *plVar13 = (long)pSVar20;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    uVar4 = this->frame_rows;
    uVar7 = -uVar4;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar23 = 1;
    if (9 < uVar7) {
      uVar25 = (ulong)uVar7;
      uVar11 = 4;
      do {
        uVar23 = uVar11;
        uVar19 = (uint)uVar25;
        if (uVar19 < 100) {
          uVar23 = uVar23 - 2;
          goto LAB_001105d9;
        }
        if (uVar19 < 1000) {
          uVar23 = uVar23 - 1;
          goto LAB_001105d9;
        }
        if (uVar19 < 10000) goto LAB_001105d9;
        uVar25 = uVar25 / 10000;
        uVar11 = uVar23 + 4;
      } while (99999 < uVar19);
      uVar23 = uVar23 + 1;
    }
LAB_001105d9:
    paVar1 = &__str_3.field_2;
    __str_3._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&__str_3,(char)uVar23 - (char)((int)uVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (__str_3._M_dataplus._M_p + (uVar4 >> 0x1f),uVar23,uVar7);
    SVar28.width = 0xf;
    SVar28.height = 0;
    if ((Size **)local_1d8.super__InputArray._0_8_ != ppSVar8) {
      SVar28 = local_1d8.super__InputArray.sz;
    }
    if ((ulong)SVar28 < __str_3._M_string_length + (long)local_1d8.super__InputArray.obj) {
      uVar29._0_4_ = 0xf;
      uVar29._4_4_ = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_3._M_dataplus._M_p != paVar1) {
        uVar29 = __str_3.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar29 < __str_3._M_string_length + (long)local_1d8.super__InputArray.obj)
      goto LAB_0011065c;
      plVar13 = (long *)std::__cxx11::string::replace
                                  ((ulong)&__str_3,0,(char *)0x0,local_1d8.super__InputArray._0_8_);
    }
    else {
LAB_0011065c:
      plVar13 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_1d8,(ulong)__str_3._M_dataplus._M_p);
    }
    local_218._0_8_ = &local_218.sz;
    pSVar20 = (Size *)(plVar13 + 2);
    if ((Size *)*plVar13 == pSVar20) {
      local_218.sz = *pSVar20;
      lStack_200 = plVar13[3];
    }
    else {
      local_218.sz = *pSVar20;
      local_218._0_8_ = (Size *)*plVar13;
    }
    local_218.obj = (void *)plVar13[1];
    *plVar13 = (long)pSVar20;
    plVar13[1] = 0;
    *(undefined1 *)&pSVar20->width = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_218);
    pSVar20 = (Size *)(plVar13 + 2);
    if ((Size *)*plVar13 == pSVar20) {
      local_1b8.sz = *pSVar20;
      lStack_1a0 = plVar13[3];
      local_1b8._0_8_ = &local_1b8.sz;
    }
    else {
      local_1b8.sz = *pSVar20;
      local_1b8._0_8_ = (Size *)*plVar13;
    }
    local_1b8.obj = (void *)plVar13[1];
    *plVar13 = (long)pSVar20;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_190,(string *)&local_1b8);
    if ((Size *)local_1b8._0_8_ != &local_1b8.sz) {
      operator_delete((void *)local_1b8._0_8_,(ulong)((long)local_1b8.sz + 1));
    }
    if ((Size *)local_218._0_8_ != &local_218.sz) {
      operator_delete((void *)local_218._0_8_,(ulong)((long)local_218.sz + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_3._M_dataplus._M_p != paVar1) {
      operator_delete(__str_3._M_dataplus._M_p,__str_3.field_2._M_allocated_capacity + 1);
    }
    if ((Size **)local_1d8.super__InputArray._0_8_ != ppSVar8) {
      operator_delete((void *)local_1d8.super__InputArray._0_8_,
                      (ulong)((long)local_1d8.super__InputArray.sz + 1));
    }
    if ((UMat *)local_188._0_8_ != (UMat *)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
      operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
    }
    if ((Size *)local_1f8._0_8_ != (Size *)(local_1f8 + 0x10)) {
      operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._M_allocated_capacity + 1));
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    src_2._M_p = __str._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p == &__str.field_2) {
      return (UMat *)0x0;
    }
LAB_00110897:
    uVar25 = __str.field_2._M_allocated_capacity + 1;
LAB_0011089a:
    operator_delete(src_2._M_p,uVar25);
  }
  return (UMat *)0x0;
}

Assistant:

UMat *FlickerRemover::removeFlickering(const UMat &frame, double timestamp, string &error)
{
    if(frame.rows != frame_rows || frame.cols != frame_cols) {
        error = "Flickering cannot be removed. Size of the frame: " + to_string(frame.cols) + "x" +
                to_string(frame.rows) + " is different than expected: " + to_string(frame_cols) + "x" +
                to_string(frame_rows) + ".";
        return nullptr;
    }
    if(!timestampIsCloseToExpectedTimestamp(timestamp)) {
        //very unlikely. Should not happen...
        if(timestamp < expected_timestamp) {
            error = "Received unexpected timestamp: " + to_string(timestamp) + " Expected value close to: " +
                    to_string(expected_timestamp);
            return nullptr;
        }
        //calculate number of frames that were dropped
        auto number_of_dropped = (unsigned int) ((timestamp - expected_timestamp + accepted_timestamp_difference) /
                                                 timestamps_delta);
        actual_mask = (actual_mask + number_of_dropped) % (number_of_masks + 1);
        expected_timestamp = timestamp;
    }
    calculateNextExpectedTimestamp(timestamp);

    auto frame_copy = new UMat(frame_rows, frame_cols, CV_8UC1);

    if(actual_mask == number_of_masks) {
        actual_mask = 0;
        frame.convertTo(*frame_copy, CV_8UC1);
    } else {
        subtract(frame, masks[actual_mask], *frame_copy, noArray(), CV_8UC1);
        actual_mask++;
    }

    auto last_frame = frames_block.last();
    if(last_frame != nullptr) {
        auto new_adjacent_similarity = new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0));
        auto old_adjacent_similarity = adjacent_frames_similarity_levels.push(new_adjacent_similarity);

        auto ret = opencl_kernels.runKernelUpdateSimilarityLevels(*last_frame, *frame_copy, *old_adjacent_similarity,
                                                                  flickering_threshold, *new_adjacent_similarity,
                                                                  adjacent_frames_similarity_sum, error);
        delete old_adjacent_similarity;
        if(!ret) {
            delete frame_copy;
            return nullptr;
        }
    }

    //push returns pointer to the allocated earlier matrix, but do not delete, since we already returned this pointer
    //outside of this method, and it is the responsibility of the caller to delete this pointer.
    auto prev_frame = frames_block.push(frame_copy);

    if(prev_frame != nullptr) {
        auto new_similarity_levels = new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0));
        auto old_similarity_levels = corresponding_frames_similarity_levels.push(new_similarity_levels);

        auto ret = opencl_kernels.runKernelUpdateSimilarityLevels(*prev_frame, *frame_copy, *old_similarity_levels,
                                                                  flickering_threshold, *new_similarity_levels,
                                                                  corresponding_frames_similarity_sum, error);
        delete old_similarity_levels;
        if(!ret) {
            return nullptr;
        }
    }

    if(actual_mask == number_of_masks && frames_block.isFull()) {
        auto ret = opencl_kernels.runKernelUpdateFlickerCounter(adjacent_frames_similarity_sum, number_of_masks,
                                                                corresponding_frames_similarity_sum,
                                                                0.7f * (float) block_size, flicker_counter, error);
        if(!ret) {
            return nullptr;
        }
        for(int i = 0; i < (int) number_of_masks; i++) {
            ret = opencl_kernels.runKernelUpdateMasks(*(frames_block[0]), *(frames_block[i + 1]), flicker_counter,
                                                      max_allowed_flicker_duration, masks[i], error);
            if(!ret) {
                return nullptr;
            }
        }
        ret = opencl_kernels.runKernelZeroFlickerCounter(max_allowed_flicker_duration, flicker_counter, error);
        if(!ret) {
            return nullptr;
        }
    }
    return frame_copy;
}